

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall logger::OutputWorker::Log(OutputWorker *this,QueuedMessage *message)

{
  char cVar1;
  ostream *poVar2;
  void *__ptr;
  size_t __n;
  Level *in_RSI;
  string fmtstr;
  ostringstream ss;
  string local_1b8 [48];
  ostringstream local_188 [376];
  Level *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,'{');
  cVar1 = LevelToChar(*local_10);
  poVar2 = std::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,'-');
  poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 2));
  poVar2 = std::operator<<(poVar2,"} ");
  std::operator<<(poVar2,(string *)(local_10 + 4));
  std::ostream::operator<<((ostream *)local_188,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  __ptr = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  fwrite(__ptr,1,__n,_stdout);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void OutputWorker::Log(QueuedMessage& message)
{
    std::ostringstream ss;
    ss << '{' << LevelToChar(message.LogLevel) << '-' << message.ChannelName << "} " << message.Message;

#if defined(ANDROID)
    std::string fmtstr = ss.str();
    __android_log_print(ANDROID_LOG_ERROR, LOG_TAG, "%s", fmtstr.c_str());
#else // ANDROID
    ss << std::endl;
    std::string fmtstr = ss.str();
    fwrite(fmtstr.c_str(), 1, fmtstr.size(), stdout);
#endif // ANDROID
}